

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O2

void __thiscall
JsUtil::BackgroundJobProcessor::RemoveManager(BackgroundJobProcessor *this,JobManager *manager)

{
  CriticalSection *this_00;
  Type pJVar1;
  code *pcVar2;
  AutoCriticalSection this_01;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Job *pJVar6;
  ParallelThreadData *parallelThreadData;
  WaitableJobManager *waitableManager;
  undefined **ppuVar7;
  char *this_02;
  char *this_03;
  Type first;
  DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator> *pDVar8;
  AutoCriticalSection local_58;
  AutoCriticalSection lock;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x372,"(manager)","manager");
    if (!bVar3) goto LAB_005f923d;
    *puVar5 = 0;
  }
  this_00 = &this->criticalSection;
  local_58.cs = this_00;
  CCLock::Enter(&this_00->super_CCLock);
  bVar3 = JobProcessor::HasManager(&this->super_JobProcessor,manager);
  if (bVar3) {
    DoublyLinkedList<JsUtil::JobManager,_Memory::ArenaAllocator>::Unlink
              (&(this->super_JobProcessor).managers,manager);
    if (manager->numJobsAddedToProcessor != 0) {
      ppuVar7 = &PTR_013e5f18;
      puVar5 = (undefined4 *)__tls_get_addr();
      lock.cs = (CriticalSection *)
                &manager[1].
                 super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>;
      first = (Job *)0x0;
      this_03 = (char *)&(this->super_JobProcessor).jobs;
      this_02 = (char *)ppuVar7;
      pDVar8 = (DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator> *)this_03;
      while (pJVar1 = pDVar8->head, pJVar1 != (Type)0x0) {
        if (pJVar1->manager == manager) {
          if (first == (Job *)0x0) {
            first = pJVar1;
          }
        }
        else {
          if (first != (Job *)0x0) {
            this_02 = this_03;
            DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::UnlinkSubsequence
                      ((DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator> *)this_03,first,
                       (pJVar1->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).
                       previous);
            while (pJVar6 = first, pJVar6 != (Job *)0x0) {
              first = (pJVar6->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).
                      next;
              if (pJVar6->isCritical == true) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                this_02 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x395,"(!removedJob->IsCritical())","!removedJob->IsCritical()")
                ;
                if (!bVar3) goto LAB_005f923d;
                *puVar5 = 0;
              }
              uVar4 = this->numJobs;
              if (uVar4 == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                this_02 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x396,"(numJobs != 0)","numJobs != 0");
                if (!bVar3) goto LAB_005f923d;
                *puVar5 = 0;
                uVar4 = this->numJobs;
              }
              this->numJobs = uVar4 - 1;
              JobProcessor::JobProcessed((JobProcessor *)this_02,manager,pJVar6,false);
              uVar4 = manager->numJobsAddedToProcessor;
              if (uVar4 == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                this_02 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x399,"(manager->numJobsAddedToProcessor != 0)",
                                   "manager->numJobsAddedToProcessor != 0");
                if (!bVar3) goto LAB_005f923d;
                *puVar5 = 0;
                uVar4 = manager->numJobsAddedToProcessor;
              }
              manager->numJobsAddedToProcessor = uVar4 - 1;
              if ((manager->isWaitable == true) && ((Job *)manager[1]._vptr_JobManager == pJVar6)) {
                this_02 = (char *)lock.cs;
                Event::Set((Event *)lock.cs);
                manager[1]._vptr_JobManager = (_func_int **)0x0;
              }
            }
          }
          first = (Type)0x0;
        }
        pDVar8 = (DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator> *)
                 &(pJVar1->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).next;
      }
      if (first != (Job *)0x0) {
        DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::UnlinkSubsequenceFromEnd
                  ((DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator> *)this_03,first);
        while (pJVar6 = first, this_02 = this_03, pJVar6 != (Job *)0x0) {
          first = (pJVar6->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).next;
          if (pJVar6->isCritical == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            this_03 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
            ;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3af,"(!removedJob->IsCritical())","!removedJob->IsCritical()");
            if (!bVar3) goto LAB_005f923d;
            *puVar5 = 0;
          }
          uVar4 = this->numJobs;
          if (uVar4 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            this_03 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
            ;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3b0,"(numJobs != 0)","numJobs != 0");
            if (!bVar3) goto LAB_005f923d;
            *puVar5 = 0;
            uVar4 = this->numJobs;
          }
          this->numJobs = uVar4 - 1;
          JobProcessor::JobProcessed((JobProcessor *)this_03,manager,pJVar6,false);
          uVar4 = manager->numJobsAddedToProcessor;
          if (uVar4 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            this_03 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
            ;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3b3,"(manager->numJobsAddedToProcessor != 0)",
                               "manager->numJobsAddedToProcessor != 0");
            if (!bVar3) goto LAB_005f923d;
            *puVar5 = 0;
            uVar4 = manager->numJobsAddedToProcessor;
          }
          manager->numJobsAddedToProcessor = uVar4 - 1;
          if ((manager->isWaitable == true) && ((Job *)manager[1]._vptr_JobManager == pJVar6)) {
            this_03 = (char *)lock.cs;
            Event::Set((Event *)lock.cs);
            manager[1]._vptr_JobManager = (_func_int **)0x0;
          }
        }
      }
      uVar4 = manager->numJobsAddedToProcessor;
      if (uVar4 == 0) {
        JobProcessor::LastJobProcessed((JobProcessor *)this_02,manager);
      }
      else {
        if (manager->isWaitable == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3c9,"(manager->isWaitable)","manager->isWaitable");
          if (!bVar3) goto LAB_005f923d;
          *puVar5 = 0;
        }
        pJVar6 = GetCurrentJobOfManager(this,manager);
        if (pJVar6 == (Job *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3ca,"(GetCurrentJobOfManager(manager))",
                             "GetCurrentJobOfManager(manager)");
          if (!bVar3) goto LAB_005f923d;
          *puVar5 = 0;
        }
      }
      AutoCriticalSection::~AutoCriticalSection(&local_58);
      if (uVar4 == 0) {
        return;
      }
      CCLock::Enter(&this_00->super_CCLock);
      this_01 = lock;
      do {
        pJVar6 = GetCurrentJobOfManager(this,manager);
        if (pJVar6 == (Job *)0x0) {
          CCLock::Leave(&this_00->super_CCLock);
          return;
        }
        if (manager[1]._vptr_JobManager != (_func_int **)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3d9,"(!waitableManager->jobBeingWaitedUpon)",
                             "!waitableManager->jobBeingWaitedUpon");
          if (!bVar3) goto LAB_005f923d;
          *puVar5 = 0;
        }
        manager[1]._vptr_JobManager = (_func_int **)pJVar6;
        Event::Reset((Event *)this_01.cs);
        parallelThreadData = GetThreadDataFromCurrentJob(this,(Job *)manager[1]._vptr_JobManager);
        CCLock::Leave(&this_00->super_CCLock);
        WaitWithThread(this,parallelThreadData,(Event *)this_01.cs,0xffffffff);
        CCLock::Enter(&this_00->super_CCLock);
        manager[1]._vptr_JobManager = (_func_int **)0x0;
      } while( true );
    }
    pJVar6 = GetCurrentJobOfManager(this,manager);
    if (pJVar6 != (Job *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                         ,0x382,"(!GetCurrentJobOfManager(manager))",
                         "!GetCurrentJobOfManager(manager)");
      if (!bVar3) {
LAB_005f923d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  AutoCriticalSection::~AutoCriticalSection(&local_58);
  return;
}

Assistant:

void BackgroundJobProcessor::RemoveManager(JobManager *const manager)
    {
        Assert(manager);

        ParallelThreadData *threadDataProcessingCurrentJob = nullptr;
        {
            AutoCriticalSection lock(&criticalSection);
            // Managers must remove themselves. Hence, Close does not remove managers. So, not asserting on !IsClosed().

            if (!HasManager(manager))
            {
                // Since this manager isn't owned by this processor, no need to remove and cleanup
                return;
            }

            managers.Unlink(manager);
            if(manager->numJobsAddedToProcessor == 0)
            {
                Assert(!GetCurrentJobOfManager(manager));
                return;
            }

            // Remove this manager's jobs from the queue
            Job *firstJob = 0;
            for(Job *job = jobs.Head(); job; job = job->Next())
            {
                if(job->Manager() == manager)
                {
                    if(!firstJob)
                        firstJob = job;
                }
                else if(firstJob)
                {
                    jobs.UnlinkSubsequence(firstJob, job->Previous());
                    for(Job *removedJob = firstJob; removedJob;)
                    {
                        Job *const next = removedJob->Next();
                        Assert(!removedJob->IsCritical());
                        Assert(numJobs != 0);
                        --numJobs;
                        JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                        Assert(manager->numJobsAddedToProcessor != 0);
                        --manager->numJobsAddedToProcessor;
                        if(manager->isWaitable)
                        {
                            WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                            if(waitableManager->jobBeingWaitedUpon == removedJob)
                            {
                                waitableManager->jobBeingWaitedUponProcessed.Set();
                                waitableManager->jobBeingWaitedUpon = 0;
                            }
                        }
                        removedJob = next;
                    }
                    firstJob = 0;
                }
            }
            if(firstJob)
            {
                jobs.UnlinkSubsequenceFromEnd(firstJob);
                for(Job *removedJob = firstJob; removedJob;)
                {
                    Job *const next = removedJob->Next();
                    Assert(!removedJob->IsCritical());
                    Assert(numJobs != 0);
                    --numJobs;
                    JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                    Assert(manager->numJobsAddedToProcessor != 0);
                    --manager->numJobsAddedToProcessor;
                    if(manager->isWaitable)
                    {
                        WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                        if(waitableManager->jobBeingWaitedUpon == removedJob)
                        {
                            waitableManager->jobBeingWaitedUponProcessed.Set();
                            waitableManager->jobBeingWaitedUpon = 0;
                        }
                    }
                    removedJob = next;
                }
            }

            if(manager->numJobsAddedToProcessor == 0)
            {
                LastJobProcessed(manager);
                return;
            }

            Assert(manager->numJobsAddedToProcessor >= 1);
            Assert(manager->isWaitable);
            Assert(GetCurrentJobOfManager(manager));

        }

        //Wait for all the on going jobs to complete.
        criticalSection.Enter();
        while (true)
        {
            Job *job = GetCurrentJobOfManager(manager);
            if (!job)
            {
                break;
            }

            WaitableJobManager * const waitableManager = static_cast<WaitableJobManager *>(manager);
            Assert(!waitableManager->jobBeingWaitedUpon);

            waitableManager->jobBeingWaitedUpon = job;
            waitableManager->jobBeingWaitedUponProcessed.Reset();

            threadDataProcessingCurrentJob = GetThreadDataFromCurrentJob(waitableManager->jobBeingWaitedUpon);
            criticalSection.Leave();

            WaitWithThread(threadDataProcessingCurrentJob, waitableManager->jobBeingWaitedUponProcessed);

            criticalSection.Enter();
            waitableManager->jobBeingWaitedUpon = 0;
        }
        criticalSection.Leave();
    }